

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::removeCutsFromModel(HighsPostsolveStack *this,HighsInt numCuts)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  size_type __new_size;
  
  iVar3 = this->origNumRow - numCuts;
  piVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __new_size = (long)piVar2 - (long)piVar1 >> 2;
  this->origNumRow = iVar3;
  if (piVar2 != piVar1) {
    while (iVar3 <= piVar1[__new_size - 1]) {
      __new_size = __new_size - 1;
      if (__new_size == 0) {
        std::vector<int,_std::allocator<int>_>::resize(&this->origRowIndex,0);
        return;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->origRowIndex,__new_size);
  return;
}

Assistant:

void removeCutsFromModel(HighsInt numCuts) {
    origNumRow -= numCuts;

    size_t origRowIndexSize = origRowIndex.size();
    for (size_t i = origRowIndex.size(); i > 0; --i) {
      if (origRowIndex[i - 1] < origNumRow) break;
      --origRowIndexSize;
    }

    origRowIndex.resize(origRowIndexSize);
  }